

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall google::protobuf::internal::ExtensionSet::IsInitialized(ExtensionSet *this)

{
  bool bVar1;
  CppType CVar2;
  int iVar3;
  uint uVar4;
  pointer ppVar5;
  Extension *pEVar6;
  MessageLite *pMVar7;
  ulong uVar8;
  int local_34;
  int i;
  Extension *extension;
  _Self local_20;
  const_iterator iter;
  ExtensionSet *this_local;
  
  iter._M_node = (_Base_ptr)this;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::begin(&this->extensions_);
  do {
    extension = (Extension *)
                std::
                map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                ::end(&this->extensions_);
    bVar1 = std::operator!=(&local_20,(_Self *)&extension);
    if (!bVar1) {
      return true;
    }
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_20);
    pEVar6 = &ppVar5->second;
    CVar2 = anon_unknown_29::cpp_type((ppVar5->second).type);
    if (CVar2 == CPPTYPE_MESSAGE) {
      if (((ppVar5->second).is_repeated & 1U) == 0) {
        if (((ppVar5->second).field_0xa & 1) == 0) {
          if (((byte)(ppVar5->second).field_0xa >> 4 & 1) == 0) {
            uVar8 = (**(code **)((((pEVar6->field_0).repeated_string_value)->
                                 super_RepeatedPtrFieldBase).arena_ + 0x40))();
            if ((uVar8 & 1) == 0) {
              return false;
            }
          }
          else {
            uVar8 = (**(code **)((((pEVar6->field_0).repeated_string_value)->
                                 super_RepeatedPtrFieldBase).arena_ + 0x48))();
            if ((uVar8 & 1) == 0) {
              return false;
            }
          }
        }
      }
      else {
        for (local_34 = 0;
            iVar3 = RepeatedPtrField<google::protobuf::MessageLite>::size
                              ((pEVar6->field_0).repeated_message_value), local_34 < iVar3;
            local_34 = local_34 + 1) {
          pMVar7 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                             ((pEVar6->field_0).repeated_message_value,local_34);
          uVar4 = (*pMVar7->_vptr_MessageLite[8])();
          if ((uVar4 & 1) == 0) {
            return false;
          }
        }
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
    ::operator++(&local_20);
  } while( true );
}

Assistant:

bool ExtensionSet::IsInitialized() const {
  // Extensions are never required.  However, we need to check that all
  // embedded messages are initialized.
  for (ExtensionMap::const_iterator iter = extensions_.begin();
       iter != extensions_.end(); ++iter) {
    const Extension& extension = iter->second;
    if (cpp_type(extension.type) == WireFormatLite::CPPTYPE_MESSAGE) {
      if (extension.is_repeated) {
        for (int i = 0; i < extension.repeated_message_value->size(); i++) {
          if (!extension.repeated_message_value->Get(i).IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!extension.is_cleared) {
          if (extension.is_lazy) {
            if (!extension.lazymessage_value->IsInitialized()) return false;
          } else {
            if (!extension.message_value->IsInitialized()) return false;
          }
        }
      }
    }
  }

  return true;
}